

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdEncodeBase58(void *handle,char *buffer,bool use_checksum,char **output)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 *in_RCX;
  byte in_DL;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  string base58_1;
  string base58;
  ByteData data;
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe90;
  allocator *paVar3;
  CryptoUtil local_138 [8];
  string *in_stack_fffffffffffffed0;
  CryptoUtil local_118 [39];
  allocator local_f1;
  string local_f0;
  ByteData local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  byte local_19;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 == (char *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x369;
    local_50.funcname = "CfdEncodeBase58";
    cfd::core::logger::warn<>(&local_50,"buffer is null.");
    local_72 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. buffer is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe90,error_code,in_stack_fffffffffffffe80);
    local_72 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x36f;
    local_90.funcname = "CfdEncodeBase58";
    cfd::core::logger::warn<>(&local_90,"output is null.");
    local_b2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. output is null.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe90,error_code,in_stack_fffffffffffffe80);
    local_b2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar3 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,local_18,paVar3);
  cfd::core::ByteData::ByteData(&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if ((local_19 & 1) == 0) {
    cfd::core::CryptoUtil::EncodeBase58_abi_cxx11_(local_138,&local_d0);
    pcVar2 = cfd::capi::CreateString(in_stack_fffffffffffffed0);
    *local_28 = pcVar2;
    std::__cxx11::string::~string((string *)local_138);
  }
  else {
    cfd::core::CryptoUtil::EncodeBase58Check_abi_cxx11_(local_118,&local_d0);
    pcVar2 = cfd::capi::CreateString(in_stack_fffffffffffffed0);
    *local_28 = pcVar2;
    std::__cxx11::string::~string((string *)local_118);
  }
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x57a5b4);
  return local_4;
}

Assistant:

int CfdEncodeBase58(
    void* handle, const char* buffer, bool use_checksum, char** output) {
  try {
    cfd::Initialize();
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    ByteData data(buffer);
    if (use_checksum) {
      auto base58 = cfd::core::CryptoUtil::EncodeBase58Check(data);
      *output = cfd::capi::CreateString(base58);
    } else {
      auto base58 = cfd::core::CryptoUtil::EncodeBase58(data);
      *output = cfd::capi::CreateString(base58);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}